

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::changeEvent(QToolButton *this,QEvent *e)

{
  byte *pbVar1;
  QWidgetPrivate *this_00;
  undefined4 uVar2;
  QToolBar *pQVar3;
  QStyle *pQVar4;
  
  this_00 = *(QWidgetPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if (*(short *)(e + 8) == 100) {
    pQVar4 = QWidget::style((QWidget *)this);
    uVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x34,0,this,0);
    *(undefined4 *)((long)&this_00[1].focus_next + 4) = uVar2;
    QWidgetPrivate::setLayoutItemMargins(this_00,SE_ToolButtonLayoutItem,(QStyleOption *)0x0);
  }
  else if (*(short *)(e + 8) == 0x15) {
    pQVar3 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>(*(QObject **)&this_00->field_0x10);
    if (pQVar3 != (QToolBar *)0x0) {
      pbVar1 = (byte *)((long)&this_00[1].focus_child + 4);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  QAbstractButton::changeEvent(&this->super_QAbstractButton,e);
  return;
}

Assistant:

void QToolButton::changeEvent(QEvent *e)
{
#if QT_CONFIG(toolbar)
    Q_D(QToolButton);
    if (e->type() == QEvent::ParentChange) {
        if (qobject_cast<QToolBar*>(parentWidget()))
            d->autoRaise = true;
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->delay = style()->styleHint(QStyle::SH_ToolButton_PopupDelay, nullptr, this);
        d->setLayoutItemMargins(QStyle::SE_ToolButtonLayoutItem);
    }
#endif
    QAbstractButton::changeEvent(e);
}